

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

string * __thiscall
pfederc::ProgramExpr::toString_abi_cxx11_(string *__return_storage_ptr__,ProgramExpr *this)

{
  Token *pTVar1;
  bool bVar2;
  Lexer *pLVar3;
  pointer pEVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  reference local_100;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *expr_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  Exprs *__range1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  reference local_a0;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *expr;
  const_iterator __end1;
  const_iterator __begin1;
  Exprs *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_19;
  ProgramExpr *local_18;
  ProgramExpr *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (ProgramExpr *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (this->progName != (Token *)0x0) {
    pTVar1 = this->progName;
    pLVar3 = Expr::getLexer(&this->super_Expr);
    (*pTVar1->_vptr_Token[2])
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,pTVar1
               ,pLVar3);
    std::operator+(&local_60,"use mod ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1);
    std::operator+(&local_40,&local_60,'\n');
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&__range1);
  }
  __end1 = std::
           vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
           ::begin(&this->imports);
  expr = (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
         std::
         vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
         ::end(&this->imports);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
                                     *)&expr), bVar2) {
    local_a0 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
               ::operator*(&__end1);
    pEVar4 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                       (local_a0);
    (*pEVar4->_vptr_Expr[2])();
    std::operator+(&local_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1_1,
                   '\n');
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&__range1_1);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
             ::begin(&this->defs);
  expr_1 = (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
           std::
           vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
           ::end(&this->defs);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
                             *)&expr_1), bVar2) {
    local_100 = __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
                ::operator*(&__end1_1);
    pEVar4 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                       (local_100);
    (*pEVar4->_vptr_Expr[2])();
    std::operator+(&local_120,&local_140,'\n');
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
    ::operator++(&__end1_1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ProgramExpr::toString() const noexcept {
  std::string result;
  if (progName)
    result += "use mod " + progName->toString(getLexer()) + '\n';

  for (auto &expr : imports)
    result += expr->toString() + '\n';

  for (auto &expr : defs)
    result += expr->toString() + '\n';

  return result;
}